

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O0

int archive_write_newc_header(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  wchar_t wVar2;
  int *piVar3;
  char *pcVar4;
  int64_t iVar5;
  archive_entry *in_RSI;
  archive *in_RDI;
  size_t len;
  char *path;
  archive_entry *in_stack_000000b8;
  archive_write *in_stack_000000c0;
  archive_entry *in_stack_ffffffffffffffc8;
  archive_entry *len_00;
  char **in_stack_ffffffffffffffd8;
  archive_entry *in_stack_ffffffffffffffe0;
  int local_4;
  
  mVar1 = archive_entry_filetype(in_RSI);
  if (mVar1 == 0) {
    archive_set_error(in_RDI,-1,"Filetype required");
    return -0x19;
  }
  len_00 = in_RSI;
  get_sconv((archive_write *)in_RSI);
  wVar2 = _archive_entry_pathname_l
                    (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(size_t *)len_00,
                     (archive_string_conv *)in_stack_ffffffffffffffc8);
  if ((wVar2 != L'\0') && (piVar3 = __errno_location(), *piVar3 == 0xc)) {
    archive_set_error(in_RDI,0xc,"Can\'t allocate memory for Pathname");
    return -0x1e;
  }
  if (((in_stack_ffffffffffffffd8 != (char **)0x0) &&
      (in_stack_ffffffffffffffe0 != (archive_entry *)0x0)) &&
     (*(char *)&in_stack_ffffffffffffffe0->archive != '\0')) {
    pcVar4 = archive_entry_hardlink(in_stack_ffffffffffffffc8);
    if ((pcVar4 == (char *)0x0) &&
       ((wVar2 = archive_entry_size_is_set(in_RSI), wVar2 == L'\0' ||
        (iVar5 = archive_entry_size(in_RSI), iVar5 < 0)))) {
      archive_set_error(in_RDI,-1,"Size required");
      local_4 = -0x19;
    }
    else {
      local_4 = write_header(in_stack_000000c0,in_stack_000000b8);
    }
    return local_4;
  }
  archive_set_error(in_RDI,-1,"Pathname required");
  return -0x19;
}

Assistant:

static int
archive_write_newc_header(struct archive_write *a, struct archive_entry *entry)
{
	const char *path;
	size_t len;

	if (archive_entry_filetype(entry) == 0) {
		archive_set_error(&a->archive, -1, "Filetype required");
		return (ARCHIVE_FAILED);
	}

	if (archive_entry_pathname_l(entry, &path, &len, get_sconv(a)) != 0
	    && errno == ENOMEM) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for Pathname");
		return (ARCHIVE_FATAL);
	}
	if (len == 0 || path == NULL || path[0] == '\0') {
		archive_set_error(&a->archive, -1, "Pathname required");
		return (ARCHIVE_FAILED);
	}

	if (archive_entry_hardlink(entry) == NULL
	    && (!archive_entry_size_is_set(entry) || archive_entry_size(entry) < 0)) {
		archive_set_error(&a->archive, -1, "Size required");
		return (ARCHIVE_FAILED);
	}
	return write_header(a, entry);
}